

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QList<QUrl> * __thiscall
QFileDialog::selectedUrls(QList<QUrl> *__return_storage_ptr__,QFileDialog *this)

{
  QFileDialogPrivate *this_00;
  QList<QUrl> *urls;
  long lVar1;
  QString *file;
  long in_FS_OFFSET;
  QUrl local_50;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((this_00->super_QDialogPrivate).nativeDialogInUse == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0049b59e:
      __stack_chk_fail();
    }
    QFileDialogPrivate::userSelectedFiles(__return_storage_ptr__,this_00);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedFiles((QStringList *)&local_48,this);
    QList<QUrl>::reserve(__return_storage_ptr__,local_48.size);
    for (lVar1 = local_48.size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
      QUrl::fromLocalFile((QString *)&local_50);
      QList<QUrl>::emplaceBack<QUrl>(__return_storage_ptr__,&local_50);
      QUrl::~QUrl(&local_50);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0049b59e;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QUrl> QFileDialog::selectedUrls() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        return d->userSelectedFiles();
    } else {
        QList<QUrl> urls;
        const QStringList selectedFileList = selectedFiles();
        urls.reserve(selectedFileList.size());
        for (const QString &file : selectedFileList)
            urls.append(QUrl::fromLocalFile(file));
        return urls;
    }
}